

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IdListIndex(IdList *pList,char *zName)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  
  if ((long)pList->nId < 1) {
    return -1;
  }
  lVar3 = 0;
LAB_00183db8:
  lVar4 = 0;
  do {
    bVar1 = pList->a[lVar3].zName[lVar4];
    bVar2 = zName[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar4 = lVar4 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return (int)lVar3;
  }
  lVar3 = lVar3 + 1;
  if (lVar3 == pList->nId) {
    return -1;
  }
  goto LAB_00183db8;
}

Assistant:

SQLITE_PRIVATE int sqlite3IdListIndex(IdList *pList, const char *zName){
  int i;
  assert( pList!=0 );
  for(i=0; i<pList->nId; i++){
    if( sqlite3StrICmp(pList->a[i].zName, zName)==0 ) return i;
  }
  return -1;
}